

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstant.cpp
# Opt level: O0

int TPZShapeHDivConstant<pzshape::TPZShapeQuad>::ComputeNConnectShapeF(int connect,int order)

{
  MElementType MVar1;
  int in_ESI;
  int in_EDI;
  MElementType thistype;
  size_t in_stack_00000408;
  char *in_stack_00000410;
  int local_4;
  
  MVar1 = pztopology::TPZQuadrilateral::Type();
  if (MVar1 == EOned) {
    local_4 = in_ESI + 1;
    if (in_EDI < 2) {
      local_4 = 0;
    }
  }
  else if (MVar1 == ETriangle) {
    local_4 = in_ESI + 1;
    if (3 < in_EDI) {
      local_4 = ((in_ESI + 1) * in_ESI) / 2;
    }
  }
  else if (MVar1 == EQuadrilateral) {
    local_4 = in_ESI + 1;
    if (3 < in_EDI) {
      local_4 = in_ESI * in_ESI;
    }
  }
  else if (MVar1 == ETetraedro) {
    if (in_EDI < 4) {
      local_4 = (in_ESI * ((in_ESI + 1) * 2 + 4)) / 4 + 1;
    }
    else {
      local_4 = ((in_ESI + 1) * in_ESI * ((in_ESI + 2) * 2 + 3)) / 6;
    }
  }
  else {
    if (MVar1 == EPrisma) {
      pzinternal::DebugStopImpl(in_stack_00000410,in_stack_00000408);
    }
    else if (MVar1 == ECube) {
      if (in_EDI < 4) {
        return in_ESI * (in_ESI + 2) + 1;
      }
      return in_ESI * in_ESI * (in_ESI * 2 + 3);
    }
    pzinternal::DebugStopImpl(in_stack_00000410,in_stack_00000408);
  }
  return local_4;
}

Assistant:

int TPZShapeHDivConstant<TSHAPE>::ComputeNConnectShapeF(int connect, int order)
{

#ifdef DEBUG
    if (connect < 0 || connect > TSHAPE::NFacets) {
        DebugStop();
    }
#endif
    // int order = data.fHDivConnectOrders[connect];
    MElementType thistype = TSHAPE::Type();

    if(thistype == EOned)
    {   
        order++;
        if(connect < 2) return 0;
        else return order;
        // DebugStop();
    }
    else if(thistype == ETriangle)
    {   
        order++;
        if(connect < TSHAPE::NFacets) return (order);
        else {
            order++;
            return (order-1)*(order-2)/2;
        }
    }
    else if(thistype == EQuadrilateral)
    {
        order++;
        if(connect < TSHAPE::NFacets) return (order);
        else return (order-1)*(order-1);
    }
    else if(thistype == ETetraedro)
    {
        order++;
        if(connect < TSHAPE::NFacets) return 1 + (order-1)*(2*order+4)/4;
        else {
            order++;
            return (order-1)*(order-2)*(2*order+3)/6;
        }
    }
    else if(thistype == EPrisma)
    {
        DebugStop();
        // if(connect == 0 || connect == 4) return (order+1)*(order+2)/2;
        // else if(connect < TSHAPE::NFacets) return (order+1)*(order+1);
        // else return order*order*(3*order+5)/2+7*order-2;
    }
    else if(thistype == ECube)
    {
        if(connect < TSHAPE::NFacets) return 1 + order*(order+2);
        else return order*order*(3+2*order);
    }
    DebugStop();
    unreachable();
 }